

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O1

stumpless_entry * stumpless_set_entry_app_name(stumpless_entry *entry,char *app_name)

{
  _Bool _Var1;
  char *pcVar2;
  size_t name_length;
  size_t local_20;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
LAB_0010c4bd:
    entry = (stumpless_entry *)0x0;
  }
  else {
    if (app_name == (char *)0x0) {
      pthread_lock_mutex((pthread_mutex_t *)entry->mutex);
      entry->app_name_length = 1;
      entry->app_name[0] = '-';
      pcVar2 = entry->app_name + 1;
    }
    else {
      _Var1 = validate_app_name(app_name,&local_20);
      if (!_Var1) goto LAB_0010c4bd;
      pthread_lock_mutex((pthread_mutex_t *)entry->mutex);
      entry->app_name_length = local_20;
      memcpy(entry->app_name,app_name,local_20);
      pcVar2 = entry->app_name + local_20;
    }
    *pcVar2 = '\0';
    pthread_unlock_mutex((pthread_mutex_t *)entry->mutex);
    clear_error();
  }
  return entry;
}

Assistant:

struct stumpless_entry *
stumpless_set_entry_app_name( struct stumpless_entry *entry,
                              const char *app_name ) {
  size_t name_length;

  VALIDATE_ARG_NOT_NULL( entry );

  if( unlikely( app_name && !validate_app_name( app_name, &name_length ) ) ) {
    return NULL;
  }

  lock_entry( entry );
  if( app_name ) {
    entry->app_name_length = name_length;
    memcpy( entry->app_name, app_name, name_length );
    entry->app_name[name_length] = '\0';
  } else {
    entry->app_name_length = 1;
    entry->app_name[0] = '-';
    entry->app_name[1] = '\0';
  }
  unlock_entry( entry );

  clear_error(  );
  return entry;
}